

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrWriter_cpp.h
# Opt level: O2

StrWriter * __thiscall moira::StrWriter::operator<<(StrWriter *this,Tab tab)

{
  char *pcVar1;
  
  if ((this->style->syntax & ~MOIRA_MIT) == GNU) {
    pcVar1 = this->ptr;
    this->ptr = pcVar1 + 1;
    *pcVar1 = ' ';
    return this;
  }
  pcVar1 = this->ptr;
  do {
    this->ptr = pcVar1 + 1;
    *pcVar1 = ' ';
    pcVar1 = this->ptr;
  } while (pcVar1 < this->base + tab.raw);
  return this;
}

Assistant:

StrWriter&
StrWriter::operator<<(Tab tab)
{
    switch (style.syntax) {

       case Syntax::GNU:
        case Syntax::GNU_MIT:

            *ptr++ = ' ';
            break;

        default:

            do { *ptr++ = ' '; } while (ptr < base + tab.raw);
    }

    return *this;
}